

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerElementUndefinedScoped(Lowerer *this,Instr *instr,JnHelperMethod helper)

{
  Instr *pIVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  
  pIVar1 = instr->m_prev;
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar5);
  pOVar5 = IR::Instr::UnlinkDst(instr);
  OVar3 = IR::Opnd::GetKind(pOVar5);
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind(pOVar5);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005b91ff;
      *puVar6 = 0;
    }
    if (*(char *)((long)pOVar5[1]._vptr_Opnd + 0x14) == '\x02') goto LAB_005b91c1;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x2abe,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected fieldSym as dst of Ld Undefined Scoped");
  if (!bVar4) {
LAB_005b91ff:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_005b91c1:
  LoadPropertySymAsArgument(this,instr,pOVar5);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,helper,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerElementUndefinedScoped(IR::Instr * instr, IR::JnHelperMethod helper)
{
    IR::Instr * instrPrev = instr->m_prev;

    // Pass the default instance
    IR::Opnd *src = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, src);

    // Pass the property sym to store to
    IR::Opnd * dst = instr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected fieldSym as dst of Ld Undefined Scoped");

    this->LoadPropertySymAsArgument(instr, dst);

    m_lowererMD.ChangeToHelperCall(instr, helper);

    return instrPrev;
}